

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_holder.hpp
# Opt level: O0

void __thiscall asio::detail::socket_holder::reset(socket_holder *this)

{
  int *in_RDI;
  state_type state;
  error_code ec;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  
  if (*in_RDI != -1) {
    std::error_code::error_code
              ((error_code *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
    socket_ops::close(*in_RDI);
    *in_RDI = -1;
  }
  return;
}

Assistant:

void reset()
  {
    if (socket_ != invalid_socket)
    {
      asio::error_code ec;
      socket_ops::state_type state = 0;
      socket_ops::close(socket_, state, true, ec);
      socket_ = invalid_socket;
    }
  }